

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::scoutpoint(tetgenmesh *this,point searchpt,triface *searchtet,int randflag)

{
  int iVar1;
  double dVar2;
  point pdVar3;
  point pdVar4;
  point pdVar5;
  point pdVar6;
  tetrahedron *pppdVar7;
  double dStack_80;
  int t1ver;
  double ori4;
  double ori3;
  double ori2;
  double ori1;
  double vol;
  locateresult loc;
  point pd;
  point pc;
  point pb;
  point pa;
  int randflag_local;
  triface *searchtet_local;
  point searchpt_local;
  tetgenmesh *this_local;
  
  ori3 = 0.0;
  ori4 = 0.0;
  dStack_80 = 0.0;
  if (randflag == 0) {
    if (searchtet->tet == (tetrahedron *)0x0) {
      triface::operator=(searchtet,&this->recenttet);
    }
  }
  else {
    randomsample(this,searchpt,searchtet);
  }
  vol._4_4_ = locate(this,searchpt,searchtet,0);
  if (vol._4_4_ == OUTSIDE) {
    if (this->b->convex != 0) {
      return 1;
    }
    pdVar3 = org(this,searchtet);
    pdVar4 = dest(this,searchtet);
    pdVar5 = apex(this,searchtet);
    dVar2 = triarea(this,pdVar3,pdVar4,pdVar5);
    ori2 = orient3dfast(this,pdVar3,pdVar4,pdVar5,searchpt);
    if (ABS(ori2 / dVar2) < this->b->epsilon) {
      vol._4_4_ = ONFACE;
      iVar1 = searchtet->ver;
      decode(this,searchtet->tet[(int)(searchtet->ver & 3)],searchtet);
      searchtet->ver = fsymtbl[iVar1][searchtet->ver];
    }
  }
  if (vol._4_4_ == OUTSIDE) {
    memorypool::traversalinit(this->tetrahedrons);
    pppdVar7 = tetrahedrontraverse(this);
    searchtet->tet = pppdVar7;
    while (searchtet->tet != (tetrahedron *)0x0) {
      pdVar3 = org(this,searchtet);
      pdVar4 = dest(this,searchtet);
      pdVar5 = apex(this,searchtet);
      pdVar6 = oppo(this,searchtet);
      dVar2 = orient3dfast(this,pdVar3,pdVar4,pdVar5,pdVar6);
      if (dVar2 < 0.0) {
        ori2 = orient3dfast(this,pdVar3,pdVar4,pdVar5,searchpt);
        if (ABS(ori2 / dVar2) < this->b->epsilon) {
          ori2 = 0.0;
        }
        if (ori2 <= 0.0) {
          ori3 = orient3dfast(this,pdVar4,pdVar3,pdVar6,searchpt);
          if (ABS(ori3 / dVar2) < this->b->epsilon) {
            ori3 = 0.0;
          }
          if (ori3 <= 0.0) {
            ori4 = orient3dfast(this,pdVar5,pdVar4,pdVar6,searchpt);
            if (ABS(ori4 / dVar2) < this->b->epsilon) {
              ori4 = 0.0;
            }
            if (ori4 <= 0.0) {
              dStack_80 = orient3dfast(this,pdVar3,pdVar5,pdVar6,searchpt);
              if (ABS(dStack_80 / dVar2) < this->b->epsilon) {
                dStack_80 = 0.0;
              }
              if (dStack_80 <= 0.0) break;
            }
          }
        }
      }
      pppdVar7 = tetrahedrontraverse(this);
      searchtet->tet = pppdVar7;
    }
    this->nonregularcount = this->nonregularcount + 1;
  }
  else {
    pdVar3 = org(this,searchtet);
    pdVar4 = dest(this,searchtet);
    pdVar5 = apex(this,searchtet);
    pdVar6 = oppo(this,searchtet);
    dVar2 = orient3dfast(this,pdVar3,pdVar4,pdVar5,pdVar6);
    ori2 = orient3dfast(this,pdVar3,pdVar4,pdVar5,searchpt);
    ori3 = orient3dfast(this,pdVar4,pdVar3,pdVar6,searchpt);
    ori4 = orient3dfast(this,pdVar5,pdVar4,pdVar6,searchpt);
    dStack_80 = orient3dfast(this,pdVar3,pdVar5,pdVar6,searchpt);
    if (ABS(ori2 / dVar2) < this->b->epsilon) {
      ori2 = 0.0;
    }
    if (ABS(ori3 / dVar2) < this->b->epsilon) {
      ori3 = 0.0;
    }
    if (ABS(ori4 / dVar2) < this->b->epsilon) {
      ori4 = 0.0;
    }
    if (ABS(dStack_80 / dVar2) < this->b->epsilon) {
      dStack_80 = 0.0;
    }
  }
  if (searchtet->tet == (tetrahedron *)0x0) {
    vol._4_4_ = 1;
  }
  else if ((ori2 != 0.0) || (NAN(ori2))) {
    if ((ori3 != 0.0) || (NAN(ori3))) {
      if ((ori4 != 0.0) || (NAN(ori4))) {
        if ((dStack_80 != 0.0) || (NAN(dStack_80))) {
          vol._4_4_ = 2;
        }
        else {
          eprevself(this,searchtet);
          esymself(this,searchtet);
          vol._4_4_ = 3;
        }
      }
      else {
        enextself(this,searchtet);
        esymself(this,searchtet);
        if ((dStack_80 != 0.0) || (NAN(dStack_80))) {
          vol._4_4_ = 3;
        }
        else {
          eprevself(this,searchtet);
          vol._4_4_ = 4;
        }
      }
    }
    else {
      esymself(this,searchtet);
      if ((ori4 != 0.0) || (NAN(ori4))) {
        if ((dStack_80 != 0.0) || (NAN(dStack_80))) {
          vol._4_4_ = 3;
        }
        else {
          enextself(this,searchtet);
          vol._4_4_ = 4;
        }
      }
      else {
        eprevself(this,searchtet);
        if ((dStack_80 != 0.0) || (NAN(dStack_80))) {
          vol._4_4_ = 4;
        }
        else {
          vol._4_4_ = 5;
        }
      }
    }
  }
  else if ((ori3 != 0.0) || (NAN(ori3))) {
    if ((ori4 != 0.0) || (NAN(ori4))) {
      if ((dStack_80 != 0.0) || (NAN(dStack_80))) {
        vol._4_4_ = 3;
      }
      else {
        eprevself(this,searchtet);
        vol._4_4_ = 4;
      }
    }
    else if ((dStack_80 != 0.0) || (NAN(dStack_80))) {
      enextself(this,searchtet);
      vol._4_4_ = 4;
    }
    else {
      eprevself(this,searchtet);
      vol._4_4_ = 5;
    }
  }
  else if ((ori4 != 0.0) || (NAN(ori4))) {
    if ((dStack_80 != 0.0) || (NAN(dStack_80))) {
      vol._4_4_ = 4;
    }
    else {
      vol._4_4_ = 5;
    }
  }
  else {
    enextself(this,searchtet);
    vol._4_4_ = 5;
  }
  return vol._4_4_;
}

Assistant:

int tetgenmesh::scoutpoint(point searchpt, triface *searchtet, int randflag)
{
  point pa, pb, pc, pd;
  enum locateresult loc = OUTSIDE;
  REAL vol, ori1, ori2 = 0, ori3 = 0, ori4 = 0;
  int t1ver;


  // Randomly select a good starting tet.
  if (randflag) {
    randomsample(searchpt, searchtet);
  } else {
    if (searchtet->tet == NULL) {
      *searchtet = recenttet;
    }
  }
  loc = locate(searchpt, searchtet);

  if (loc == OUTSIDE) {
    if (b->convex) { // -c option
      // The point lies outside of the convex hull.
      return (int) loc;
    }
    // Test if it lies nearly on the hull face.
    // Reuse vol, ori1.
    pa = org(*searchtet);
    pb = dest(*searchtet);
    pc = apex(*searchtet);
    vol = triarea(pa, pb, pc);
    ori1 = orient3dfast(pa, pb, pc, searchpt);
    if (fabs(ori1 / vol) < b->epsilon) {
      loc = ONFACE; // On face (or on edge, or on vertex).
      fsymself(*searchtet);
    }
  }

  if (loc != OUTSIDE) {
    // Round the result of location.
    pa = org(*searchtet);
    pb = dest(*searchtet);
    pc = apex(*searchtet);
    pd = oppo(*searchtet);
    vol = orient3dfast(pa, pb, pc, pd);
    ori1 = orient3dfast(pa, pb, pc, searchpt);
    ori2 = orient3dfast(pb, pa, pd, searchpt);
    ori3 = orient3dfast(pc, pb, pd, searchpt);
    ori4 = orient3dfast(pa, pc, pd, searchpt);
    if (fabs(ori1 / vol) < b->epsilon) ori1 = 0;
    if (fabs(ori2 / vol) < b->epsilon) ori2 = 0;
    if (fabs(ori3 / vol) < b->epsilon) ori3 = 0;
    if (fabs(ori4 / vol) < b->epsilon) ori4 = 0;
  } else { // if (loc == OUTSIDE) {
    // Do a brute force search for the point (with rounding).
    tetrahedrons->traversalinit();
    searchtet->tet = tetrahedrontraverse();
    while (searchtet->tet != NULL) {
      pa = org(*searchtet);
      pb = dest(*searchtet);
      pc = apex(*searchtet);
      pd = oppo(*searchtet);

      vol = orient3dfast(pa, pb, pc, pd); 
      if (vol < 0) {
        ori1 = orient3dfast(pa, pb, pc, searchpt);
        if (fabs(ori1 / vol) < b->epsilon) ori1 = 0; // Rounding.
        if (ori1 <= 0) {
          ori2 = orient3dfast(pb, pa, pd, searchpt);
          if (fabs(ori2 / vol) < b->epsilon) ori2 = 0;
          if (ori2 <= 0) {
            ori3 = orient3dfast(pc, pb, pd, searchpt);
            if (fabs(ori3 / vol) < b->epsilon) ori3 = 0;
            if (ori3 <= 0) {
              ori4 = orient3dfast(pa, pc, pd, searchpt);
              if (fabs(ori4 / vol) < b->epsilon) ori4 = 0;
              if (ori4 <= 0) {
                // Found the tet. Return its location. 
                break;
              } // ori4
            } // ori3
          } // ori2
        } // ori1
      }

      searchtet->tet = tetrahedrontraverse();
    } // while (searchtet->tet != NULL)
    nonregularcount++;  // Re-use this counter.
  }

  if (searchtet->tet != NULL) {
    // Return the point location.
    if (ori1 == 0) { // on face [a,b,c]
      if (ori2 == 0) { // on edge [a,b].
        if (ori3 == 0) { // on vertex [b].
          enextself(*searchtet); // [b,c,a,d]
          loc = ONVERTEX;
        } else {
          if (ori4 == 0) { // on vertex [a]
            loc =  ONVERTEX; // [a,b,c,d]
          } else {    
            loc =  ONEDGE; // [a,b,c,d]
          }
        }
      } else { // ori2 != 0
        if (ori3 == 0) { // on edge [b,c]
          if (ori4 == 0) { // on vertex [c]
            eprevself(*searchtet); // [c,a,b,d]
            loc =  ONVERTEX;
          } else {
            enextself(*searchtet); // [b,c,a,d]
            loc =  ONEDGE;
          }
        } else { // ori3 != 0
          if (ori4 == 0) { // on edge [c,a]
            eprevself(*searchtet); // [c,a,b,d]
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        }
      }
    } else { // ori1 != 0
      if (ori2 == 0) { // on face [b,a,d]
        esymself(*searchtet); // [b,a,d,c]
        if (ori3 == 0) { // on edge [b,d]
          eprevself(*searchtet); // [d,b,a,c]
          if (ori4 == 0) { // on vertex [d]                      
            loc =  ONVERTEX;
          } else {
            loc =  ONEDGE;
          }
        } else { // ori3 != 0
          if (ori4 == 0) { // on edge [a,d]
            enextself(*searchtet); // [a,d,b,c]
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        }
      } else { // ori2 != 0
        if (ori3 == 0) { // on face [c,b,d]
          enextself(*searchtet);
          esymself(*searchtet);
          if (ori4 == 0) { // on edge [c,d]
            eprevself(*searchtet);
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        } else {
          if (ori4 == 0) { // on face [a,c,d]
            eprevself(*searchtet);
            esymself(*searchtet);
            loc =  ONFACE;
          } else { // inside tet [a,b,c,d]
            loc =  INTETRAHEDRON;
          } // ori4
        } // ori3
      } // ori2
    } // ori1
  } else {
    loc = OUTSIDE;
  }

  return (int) loc;
}